

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O1

void * Memory::InPlaceFreeListPolicy::Allocate(void *policy,size_t size)

{
  undefined8 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (policy == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                       ,0x30a,"(policy)","policy");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  puVar1 = *(undefined8 **)((long)policy + (size >> 4) * 8 + -8);
  if (puVar1 != (undefined8 *)0x0) {
    *(undefined8 *)((long)policy + (size >> 4) * 8 + -8) = *puVar1;
    *puVar1 = 0xfefefefefefefefe;
  }
  return puVar1;
}

Assistant:

void * InPlaceFreeListPolicy::Allocate(void * policy, size_t size)
{
    Assert(policy);

    FreeObject ** freeObjectLists = reinterpret_cast<FreeObject **>(policy);
    size_t index = (size >> ArenaAllocator::ObjectAlignmentBitShift) - 1;
    FreeObject * freeObject = freeObjectLists[index];

    if (NULL != freeObject)
    {
        freeObjectLists[index] = freeObject->next;

#ifdef ARENA_MEMORY_VERIFY
#ifndef _MSC_VER
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wsizeof-pointer-memaccess"
#endif
        // Make sure the next pointer bytes are also DbgFreeMemFill-ed.
        memset(freeObject, DbgFreeMemFill, sizeof(freeObject->next));
#ifndef _MSC_VER
#pragma clang diagnostic pop
#endif
#endif
    }

    return freeObject;
}